

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_codestream_info_v2_t * j2k_get_cstr_info(opj_j2k_v2_t *p_j2k)

{
  opj_tccp_t *poVar1;
  uint uVar2;
  OPJ_UINT32 OVar3;
  opj_tcp_v2_t *poVar4;
  opj_tccp_t *poVar5;
  undefined8 uVar6;
  opj_tccp_info_t *poVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  OPJ_PROG_ORDER OVar10;
  opj_codestream_info_v2_t *poVar11;
  opj_tccp_info_t *poVar12;
  ulong uVar13;
  uint uVar14;
  OPJ_UINT32 *pOVar15;
  ulong uVar16;
  int *piVar17;
  
  uVar2 = p_j2k->m_private_image->numcomps;
  poVar11 = (opj_codestream_info_v2_t *)calloc(1,0x48);
  poVar11->nbcomps = uVar2;
  OVar3 = (p_j2k->m_cp).ty0;
  OVar8 = (p_j2k->m_cp).tdx;
  OVar9 = (p_j2k->m_cp).tdy;
  poVar11->tx0 = (p_j2k->m_cp).tx0;
  poVar11->ty0 = OVar3;
  poVar11->tdx = OVar8;
  poVar11->tdy = OVar9;
  OVar3 = (p_j2k->m_cp).th;
  poVar11->tw = (p_j2k->m_cp).tw;
  poVar11->th = OVar3;
  poVar4 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  OVar10 = poVar4->prg;
  (poVar11->m_default_tile_info).csty = poVar4->csty;
  (poVar11->m_default_tile_info).prg = OVar10;
  (poVar11->m_default_tile_info).numlayers = poVar4->numlayers;
  (poVar11->m_default_tile_info).mct = poVar4->mct;
  poVar12 = (opj_tccp_info_t *)calloc((ulong)uVar2,0x438);
  (poVar11->m_default_tile_info).tccp_info = poVar12;
  if ((uVar2 & 0xffff) != 0) {
    poVar5 = poVar4->tccps;
    pOVar15 = poVar12->stepsizes_expn;
    piVar17 = &poVar5->stepsizes[0].mant;
    uVar16 = 0;
    do {
      poVar1 = poVar5 + uVar16;
      OVar3 = poVar1->numresolutions;
      uVar6 = *(undefined8 *)&poVar1->cblkw;
      uVar14 = poVar5[uVar16].numresolutions;
      poVar7 = poVar12 + uVar16;
      poVar7->csty = poVar1->csty;
      poVar7->numresolutions = OVar3;
      *(undefined8 *)(&poVar7->csty + 2) = uVar6;
      OVar3 = poVar5[uVar16].qmfbid;
      poVar12[uVar16].cblksty = poVar5[uVar16].cblksty;
      poVar12[uVar16].qmfbid = OVar3;
      if (uVar14 < 0x21) {
        memcpy(poVar12[uVar16].prch,poVar5[uVar16].prch,(ulong)uVar14);
        memcpy(poVar12[uVar16].prcw,poVar5[uVar16].prcw,(ulong)poVar5[uVar16].numresolutions);
      }
      OVar3 = poVar5[uVar16].qntsty;
      poVar12[uVar16].qntsty = OVar3;
      poVar12[uVar16].numgbits = poVar5[uVar16].numgbits;
      uVar14 = 1;
      if (OVar3 == 1) {
LAB_001f5b28:
        uVar13 = 0;
        do {
          pOVar15[uVar13 - 0x61] = piVar17[uVar13 * 2];
          pOVar15[uVar13] = piVar17[uVar13 * 2 + -1];
          uVar13 = uVar13 + 1;
        } while (uVar14 != uVar13);
      }
      else if (poVar5[uVar16].numresolutions * 3 - 3 < 0x60) {
        uVar14 = poVar5[uVar16].numresolutions * 3 - 2;
        goto LAB_001f5b28;
      }
      poVar12[uVar16].roishift = poVar5[uVar16].roishift;
      uVar16 = uVar16 + 1;
      pOVar15 = pOVar15 + 0x10e;
      piVar17 = piVar17 + 0x10e;
    } while (uVar16 != ((ulong)uVar2 & 0xffff));
  }
  return poVar11;
}

Assistant:

opj_codestream_info_v2_t* j2k_get_cstr_info(opj_j2k_v2_t* p_j2k)
{
	OPJ_UINT16 compno;
	OPJ_UINT16 numcomps = p_j2k->m_private_image->numcomps;
	opj_tcp_v2_t *l_default_tile;
	opj_codestream_info_v2_t* cstr_info = (opj_codestream_info_v2_t*) opj_calloc(1,sizeof(opj_codestream_info_v2_t));

	cstr_info->nbcomps = p_j2k->m_private_image->numcomps;

	cstr_info->tx0 = p_j2k->m_cp.tx0;
	cstr_info->ty0 = p_j2k->m_cp.ty0;
	cstr_info->tdx = p_j2k->m_cp.tdx;
	cstr_info->tdy = p_j2k->m_cp.tdy;
	cstr_info->tw = p_j2k->m_cp.tw;
	cstr_info->th = p_j2k->m_cp.th;

	cstr_info->tile_info = NULL; /* Not fill from the main header*/

	l_default_tile = p_j2k->m_specific_param.m_decoder.m_default_tcp;

	cstr_info->m_default_tile_info.csty = l_default_tile->csty;
	cstr_info->m_default_tile_info.prg = l_default_tile->prg;
	cstr_info->m_default_tile_info.numlayers = l_default_tile->numlayers;
	cstr_info->m_default_tile_info.mct = l_default_tile->mct;

	cstr_info->m_default_tile_info.tccp_info = (opj_tccp_info_t*) opj_calloc(cstr_info->nbcomps, sizeof(opj_tccp_info_t));

	for (compno = 0; compno < numcomps; compno++) {
		opj_tccp_t *l_tccp = &(l_default_tile->tccps[compno]);
		opj_tccp_info_t *l_tccp_info = &(cstr_info->m_default_tile_info.tccp_info[compno]);
		OPJ_INT32 bandno, numbands;

		/* coding style*/
		l_tccp_info->csty = l_tccp->csty;
		l_tccp_info->numresolutions = l_tccp->numresolutions;
		l_tccp_info->cblkw = l_tccp->cblkw;
		l_tccp_info->cblkh = l_tccp->cblkh;
		l_tccp_info->cblksty = l_tccp->cblksty;
		l_tccp_info->qmfbid = l_tccp->qmfbid;
		if (l_tccp->numresolutions < J2K_MAXRLVLS)
		{
			memcpy(l_tccp_info->prch, l_tccp->prch, l_tccp->numresolutions);
			memcpy(l_tccp_info->prcw, l_tccp->prcw, l_tccp->numresolutions);
		}

		/* quantization style*/
		l_tccp_info->qntsty = l_tccp->qntsty;
		l_tccp_info->numgbits = l_tccp->numgbits;

		numbands = (l_tccp->qntsty == J2K_CCP_QNTSTY_SIQNT) ? 1 : l_tccp->numresolutions * 3 - 2;
		if (numbands < J2K_MAXBANDS) {
			for (bandno = 0; bandno < numbands; bandno++) {
				l_tccp_info->stepsizes_mant[bandno] = l_tccp->stepsizes[bandno].mant;
				l_tccp_info->stepsizes_expn[bandno] = l_tccp->stepsizes[bandno].expn;
			}
		}

		/* RGN value*/
		l_tccp_info->roishift = l_tccp->roishift;
	}


	return cstr_info;
}